

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O2

_Bool mi_heap_page_collect
                (mi_heap_t *heap,mi_page_queue_t *pq,mi_page_t *page,void *arg_collect,void *arg2)

{
  int iVar1;
  mi_segment_t *pmVar2;
  mi_segment_t *segment;
  
  iVar1 = *arg_collect;
  _mi_page_free_collect(page,iVar1 != 0);
  if (iVar1 == 1) {
    pmVar2 = (mi_segment_t *)((ulong)((long)page[-1].padding + 7U) & 0xfffffffffe000000);
    segment = (mi_segment_t *)0x0;
    if (0 < (long)pmVar2) {
      segment = pmVar2;
    }
    _mi_segment_collect(segment,true);
    if (page->used != 0) {
      return true;
    }
  }
  else if (page->used != 0) {
    if (iVar1 != 2) {
      return true;
    }
    _mi_page_abandon(page,pq);
    return true;
  }
  _mi_page_free(page,pq,iVar1 != 0);
  return true;
}

Assistant:

static bool mi_heap_page_collect(mi_heap_t* heap, mi_page_queue_t* pq, mi_page_t* page, void* arg_collect, void* arg2 ) {
  MI_UNUSED(arg2);
  MI_UNUSED(heap);
  mi_assert_internal(mi_heap_page_is_valid(heap, pq, page, NULL, NULL));
  mi_collect_t collect = *((mi_collect_t*)arg_collect);
  _mi_page_free_collect(page, collect >= MI_FORCE);
  if (collect == MI_FORCE) {
    // note: call before a potential `_mi_page_free` as the segment may be freed if this was the last used page in that segment.
    mi_segment_t* segment = _mi_page_segment(page);
    _mi_segment_collect(segment, true /* force? */);
  }
  if (mi_page_all_free(page)) {
    // no more used blocks, free the page.
    // note: this will free retired pages as well.
    _mi_page_free(page, pq, collect >= MI_FORCE);
  }
  else if (collect == MI_ABANDON) {
    // still used blocks but the thread is done; abandon the page
    _mi_page_abandon(page, pq);
  }
  return true; // don't break
}